

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O3

UniValue * __thiscall
CRPCConvertTable::ArgToUniValue
          (UniValue *__return_storage_ptr__,CRPCConvertTable *this,string_view arg_value,
          string *method,string *param_name)

{
  string_view raw;
  const_iterator cVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  long local_38;
  
  pcVar2 = (char *)arg_value._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_78,method,param_name);
  cVar1 = std::
          _Rb_tree<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Identity<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->membersByName)._M_t,&local_78);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->membersByName)._M_t._M_impl.super__Rb_tree_header)
  {
    ::UniValue::
    UniValue<std::basic_string_view<char,_std::char_traits<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
              (__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffff78);
  }
  else {
    raw._M_str = pcVar2;
    raw._M_len = 0x841c4e;
    Parse(raw);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.second._M_dataplus._M_p != &local_78.second.field_2) {
    operator_delete(local_78.second._M_dataplus._M_p,
                    local_78.second.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
    operator_delete(local_78.first._M_dataplus._M_p,local_78.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue ArgToUniValue(std::string_view arg_value, const std::string& method, const std::string& param_name)
    {
        return membersByName.count({method, param_name}) > 0 ? Parse(arg_value) : arg_value;
    }